

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZone::getDisplayName
          (TimeZone *this,UBool daylight,EDisplayType style,Locale *locale,UnicodeString *result)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  TimeZoneFormat *pTVar4;
  TimeZoneFormat *pTVar5;
  UChar *text;
  TimeZoneNames *pTVar6;
  UDate UVar7;
  uint local_168;
  uint local_118;
  uint local_f4;
  LocalPointerBase<icu_63::TimeZoneFormat> local_c0;
  LocalPointer<icu_63::TimeZoneFormat> tzfmt_2;
  UnicodeString canonicalID;
  LocalPointer<icu_63::TimeZoneNames> tznames;
  UTimeZoneNameType nameType;
  LocalPointer<icu_63::TimeZoneFormat> tzfmt_1;
  LocalPointerBase<icu_63::TimeZoneFormat> local_50;
  LocalPointer<icu_63::TimeZoneFormat> tzfmt;
  int32_t offset;
  UTimeZoneFormatTimeType timeType;
  UDate date;
  TimeZone *pTStack_30;
  UErrorCode status;
  UnicodeString *result_local;
  Locale *locale_local;
  EDisplayType style_local;
  UBool daylight_local;
  TimeZone *this_local;
  
  date._4_4_ = U_ZERO_ERROR;
  pTStack_30 = (TimeZone *)result;
  result_local = (UnicodeString *)locale;
  locale_local._0_4_ = style;
  locale_local._7_1_ = daylight;
  _style_local = this;
  UVar7 = Calendar::getNow();
  tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._4_4_ = 0;
  if ((((EDisplayType)locale_local == GENERIC_LOCATION) ||
      ((EDisplayType)locale_local == LONG_GENERIC)) || ((EDisplayType)locale_local == SHORT_GENERIC)
     ) {
    pTVar4 = TimeZoneFormat::createInstance((Locale *)result_local,(UErrorCode *)((long)&date + 4));
    LocalPointer<icu_63::TimeZoneFormat>::LocalPointer
              ((LocalPointer<icu_63::TimeZoneFormat> *)&local_50,pTVar4);
    UVar1 = ::U_FAILURE(date._4_4_);
    if (UVar1 == '\0') {
      if ((EDisplayType)locale_local == SHORT_GENERIC) {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_50);
        pTVar4 = (TimeZoneFormat *)0x2;
        (*(pTVar5->super_Format).super_UObject._vptr_UObject[8])
                  (UVar7,pTVar5,2,this,pTStack_30,
                   (undefined1 *)
                   ((long)&tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr + 4));
      }
      else if ((EDisplayType)locale_local == LONG_GENERIC) {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_50);
        pTVar4 = (TimeZoneFormat *)0x1;
        (*(pTVar5->super_Format).super_UObject._vptr_UObject[8])
                  (UVar7,pTVar5,1,this,pTStack_30,
                   (undefined1 *)
                   ((long)&tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr + 4));
      }
      else if ((EDisplayType)locale_local == GENERIC_LOCATION) {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_50);
        pTVar4 = (TimeZoneFormat *)0x0;
        (*(pTVar5->super_Format).super_UObject._vptr_UObject[8])
                  (UVar7,pTVar5,0,this,pTStack_30,
                   (undefined1 *)
                   ((long)&tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr + 4));
      }
      if (((locale_local._7_1_ != '\0') &&
          (tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._4_4_ == 1)) ||
         ((locale_local._7_1_ == '\0' &&
          (tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._4_4_ == 2)))) {
        if (locale_local._7_1_ == '\0') {
          local_f4 = (*(this->super_UObject)._vptr_UObject[8])();
        }
        else {
          iVar2 = (*(this->super_UObject)._vptr_UObject[8])();
          iVar3 = (*(this->super_UObject)._vptr_UObject[0xd])();
          local_f4 = iVar2 + iVar3;
        }
        tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = local_f4;
        if ((EDisplayType)locale_local == SHORT_GENERIC) {
          pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_50);
          pTVar4 = (TimeZoneFormat *)
                   (ulong)(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr;
          TimeZoneFormat::formatOffsetShortLocalizedGMT
                    (pTVar5,(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr,
                     (UnicodeString *)pTStack_30,(UErrorCode *)((long)&date + 4));
        }
        else {
          pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_50);
          pTVar4 = (TimeZoneFormat *)
                   (ulong)(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr;
          TimeZoneFormat::formatOffsetLocalizedGMT
                    (pTVar5,(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr,
                     (UnicodeString *)pTStack_30,(UErrorCode *)((long)&date + 4));
        }
      }
      tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = 0;
    }
    else {
      UnicodeString::remove((UnicodeString *)pTStack_30,(char *)pTVar4);
      this_local = pTStack_30;
      tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = 1;
    }
    LocalPointer<icu_63::TimeZoneFormat>::~LocalPointer
              ((LocalPointer<icu_63::TimeZoneFormat> *)&local_50);
    goto joined_r0x0023c118;
  }
  if (((EDisplayType)locale_local == LONG_GMT) || ((EDisplayType)locale_local == SHORT_GMT)) {
    pTVar4 = TimeZoneFormat::createInstance((Locale *)result_local,(UErrorCode *)((long)&date + 4));
    LocalPointer<icu_63::TimeZoneFormat>::LocalPointer
              ((LocalPointer<icu_63::TimeZoneFormat> *)&stack0xffffffffffffff98,pTVar4);
    UVar1 = ::U_FAILURE(date._4_4_);
    if (UVar1 == '\0') {
      if ((locale_local._7_1_ == '\0') ||
         (iVar2 = (*(this->super_UObject)._vptr_UObject[9])(), (char)iVar2 == '\0')) {
        local_118 = (*(this->super_UObject)._vptr_UObject[8])();
      }
      else {
        iVar2 = (*(this->super_UObject)._vptr_UObject[8])();
        iVar3 = (*(this->super_UObject)._vptr_UObject[0xd])();
        local_118 = iVar2 + iVar3;
      }
      tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = local_118;
      if ((EDisplayType)locale_local == SHORT_GMT) {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->
                           ((LocalPointerBase<icu_63::TimeZoneFormat> *)&stack0xffffffffffffff98);
        pTVar4 = (TimeZoneFormat *)
                 (ulong)(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr;
        TimeZoneFormat::formatOffsetISO8601Basic
                  (pTVar5,(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr,'\0','\0',
                   '\0',(UnicodeString *)pTStack_30,(UErrorCode *)((long)&date + 4));
      }
      else if ((EDisplayType)locale_local == LONG_GMT) {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->
                           ((LocalPointerBase<icu_63::TimeZoneFormat> *)&stack0xffffffffffffff98);
        pTVar4 = (TimeZoneFormat *)
                 (ulong)(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr;
        TimeZoneFormat::formatOffsetLocalizedGMT
                  (pTVar5,(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr,
                   (UnicodeString *)pTStack_30,(UErrorCode *)((long)&date + 4));
      }
      tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = 0;
    }
    else {
      UnicodeString::remove((UnicodeString *)pTStack_30,(char *)pTVar4);
      this_local = pTStack_30;
      tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = 1;
    }
    LocalPointer<icu_63::TimeZoneFormat>::~LocalPointer
              ((LocalPointer<icu_63::TimeZoneFormat> *)&stack0xffffffffffffff98);
    goto joined_r0x0023c118;
  }
  tznames.super_LocalPointerBase<icu_63::TimeZoneNames>.ptr._4_4_ = 0;
  if ((EDisplayType)locale_local == SHORT) {
LAB_0023c333:
    tznames.super_LocalPointerBase<icu_63::TimeZoneNames>.ptr._4_4_ = 0x10;
    if (locale_local._7_1_ != '\0') {
      tznames.super_LocalPointerBase<icu_63::TimeZoneNames>.ptr._4_4_ = 0x20;
    }
  }
  else if ((EDisplayType)locale_local == LONG) {
    tznames.super_LocalPointerBase<icu_63::TimeZoneNames>.ptr._4_4_ = 2;
    if (locale_local._7_1_ != '\0') {
      tznames.super_LocalPointerBase<icu_63::TimeZoneNames>.ptr._4_4_ = 4;
    }
  }
  else if ((EDisplayType)locale_local == SHORT_COMMONLY_USED) goto LAB_0023c333;
  pTVar4 = (TimeZoneFormat *)
           TimeZoneNames::createInstance((Locale *)result_local,(UErrorCode *)((long)&date + 4));
  LocalPointer<icu_63::TimeZoneNames>::LocalPointer
            ((LocalPointer<icu_63::TimeZoneNames> *)((long)&canonicalID.fUnion + 0x30),
             (TimeZoneNames *)pTVar4);
  UVar1 = ::U_FAILURE(date._4_4_);
  if (UVar1 == '\0') {
    text = ZoneMeta::getCanonicalCLDRID(this);
    UnicodeString::UnicodeString((UnicodeString *)&tzfmt_2,text);
    pTVar6 = LocalPointerBase<icu_63::TimeZoneNames>::operator->
                       ((LocalPointerBase<icu_63::TimeZoneNames> *)
                        ((long)&canonicalID.fUnion + 0x30));
    pTVar4 = (TimeZoneFormat *)&tzfmt_2;
    (*(pTVar6->super_UObject)._vptr_UObject[0xc])
              (UVar7,pTVar6,pTVar4,
               (ulong)tznames.super_LocalPointerBase<icu_63::TimeZoneNames>.ptr._4_4_,pTStack_30);
    UVar1 = UnicodeString::isEmpty((UnicodeString *)pTStack_30);
    if (UVar1 != '\0') {
      pTVar4 = TimeZoneFormat::createInstance
                         ((Locale *)result_local,(UErrorCode *)((long)&date + 4));
      LocalPointer<icu_63::TimeZoneFormat>::LocalPointer
                ((LocalPointer<icu_63::TimeZoneFormat> *)&local_c0,pTVar4);
      if ((locale_local._7_1_ == '\0') ||
         (iVar2 = (*(this->super_UObject)._vptr_UObject[9])(), (char)iVar2 == '\0')) {
        local_168 = (*(this->super_UObject)._vptr_UObject[8])();
      }
      else {
        iVar2 = (*(this->super_UObject)._vptr_UObject[8])();
        iVar3 = (*(this->super_UObject)._vptr_UObject[0xd])();
        local_168 = iVar2 + iVar3;
      }
      tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = local_168;
      if ((EDisplayType)locale_local == LONG) {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_c0);
        pTVar4 = (TimeZoneFormat *)
                 (ulong)(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr;
        TimeZoneFormat::formatOffsetLocalizedGMT
                  (pTVar5,(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr,
                   (UnicodeString *)pTStack_30,(UErrorCode *)((long)&date + 4));
      }
      else {
        pTVar5 = LocalPointerBase<icu_63::TimeZoneFormat>::operator->(&local_c0);
        pTVar4 = (TimeZoneFormat *)
                 (ulong)(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr;
        TimeZoneFormat::formatOffsetShortLocalizedGMT
                  (pTVar5,(uint)tzfmt.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr,
                   (UnicodeString *)pTStack_30,(UErrorCode *)((long)&date + 4));
      }
      LocalPointer<icu_63::TimeZoneFormat>::~LocalPointer
                ((LocalPointer<icu_63::TimeZoneFormat> *)&local_c0);
    }
    UnicodeString::~UnicodeString((UnicodeString *)&tzfmt_2);
    tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = 0;
  }
  else {
    UnicodeString::remove((UnicodeString *)pTStack_30,(char *)pTVar4);
    this_local = pTStack_30;
    tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr._0_4_ = 1;
  }
  LocalPointer<icu_63::TimeZoneNames>::~LocalPointer
            ((LocalPointer<icu_63::TimeZoneNames> *)((long)&canonicalID.fUnion + 0x30));
joined_r0x0023c118:
  if ((int)tzfmt_1.super_LocalPointerBase<icu_63::TimeZoneFormat>.ptr == 0) {
    UVar1 = ::U_FAILURE(date._4_4_);
    if (UVar1 != '\0') {
      UnicodeString::remove((UnicodeString *)pTStack_30,(char *)pTVar4);
    }
    this_local = pTStack_30;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZone::getDisplayName(UBool daylight, EDisplayType style, const Locale& locale, UnicodeString& result) const
{
    UErrorCode status = U_ZERO_ERROR;
    UDate date = Calendar::getNow();
    UTimeZoneFormatTimeType timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    int32_t offset;

    if (style == GENERIC_LOCATION || style == LONG_GENERIC || style == SHORT_GENERIC) {
        LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        // Generic format
        switch (style) {
        case GENERIC_LOCATION:
            tzfmt->format(UTZFMT_STYLE_GENERIC_LOCATION, *this, date, result, &timeType);
            break;
        case LONG_GENERIC:
            tzfmt->format(UTZFMT_STYLE_GENERIC_LONG, *this, date, result, &timeType);
            break;
        case SHORT_GENERIC:
            tzfmt->format(UTZFMT_STYLE_GENERIC_SHORT, *this, date, result, &timeType);
            break;
        default:
            U_ASSERT(FALSE);
        }
        // Generic format many use Localized GMT as the final fallback.
        // When Localized GMT format is used, the result might not be
        // appropriate for the requested daylight value.
        if ((daylight && timeType == UTZFMT_TIME_TYPE_STANDARD) || (!daylight && timeType == UTZFMT_TIME_TYPE_DAYLIGHT)) {
            offset = daylight ? getRawOffset() + getDSTSavings() : getRawOffset();
            if (style == SHORT_GENERIC) {
                tzfmt->formatOffsetShortLocalizedGMT(offset, result, status);
            } else {
                tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            }
        }
    } else if (style == LONG_GMT || style == SHORT_GMT) {
        LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        offset = daylight && useDaylightTime() ? getRawOffset() + getDSTSavings() : getRawOffset();
        switch (style) {
        case LONG_GMT:
            tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            break;
        case SHORT_GMT:
            tzfmt->formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, result, status);
            break;
        default:
            U_ASSERT(FALSE);
        }

    } else {
        U_ASSERT(style == LONG || style == SHORT || style == SHORT_COMMONLY_USED);
        UTimeZoneNameType nameType = UTZNM_UNKNOWN;
        switch (style) {
        case LONG:
            nameType = daylight ? UTZNM_LONG_DAYLIGHT : UTZNM_LONG_STANDARD;
            break;
        case SHORT:
        case SHORT_COMMONLY_USED:
            nameType = daylight ? UTZNM_SHORT_DAYLIGHT : UTZNM_SHORT_STANDARD;
            break;
        default:
            U_ASSERT(FALSE);
        }
        LocalPointer<TimeZoneNames> tznames(TimeZoneNames::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        UnicodeString canonicalID(ZoneMeta::getCanonicalCLDRID(*this));
        tznames->getDisplayName(canonicalID, nameType, date, result);
        if (result.isEmpty()) {
            // Fallback to localized GMT
            LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
            offset = daylight && useDaylightTime() ? getRawOffset() + getDSTSavings() : getRawOffset();
            if (style == LONG) {
                tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            } else {
                tzfmt->formatOffsetShortLocalizedGMT(offset, result, status);
            }
        }
    }
    if (U_FAILURE(status)) {
        result.remove();
    }
    return  result;
}